

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.hh
# Opt level: O2

int OB::Term::width(size_t *width_,size_t fd_)

{
  undefined8 in_RAX;
  int iVar1;
  undefined1 local_28 [2];
  ushort local_26;
  winsize w;
  
  local_26 = (ushort)((ulong)in_RAX >> 0x10);
  if (fd_ < 3) {
    iVar1 = 0;
    ioctl((int)fd_,0x5413,local_28);
    *width_ = (ulong)local_26;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

inline int width(std::size_t& width_, std::size_t fd_ = STDOUT_FILENO)
{
  if (fd_ != STDIN_FILENO && fd_ != STDOUT_FILENO && fd_ != STDERR_FILENO)
  {
    return -1;
  }

  winsize w;
  ioctl(fd_, TIOCGWINSZ, &w);

  width_ = w.ws_col;

  return 0;
}